

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

_Bool ref_mv_idx_early_breakout
                (SPEED_FEATURES *sf,RefFrameDistanceInfo *ref_frame_dist_info,MACROBLOCK *x,
                HandleInterModeArgs *args,int64_t ref_best_rd,int ref_mv_idx)

{
  MB_MODE_INFO *mbmi_00;
  int8_t iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int in_R9D;
  int drl_cost;
  size_t est_rd_rate;
  int do_prune;
  int has_nearmv_1;
  int has_nearmv;
  int is_comp_pred;
  int8_t ref_frame_type;
  MB_MODE_INFO_EXT *mbmi_ext;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  PREDICTION_MODE this_mode;
  MB_MODE_INFO *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 uVar5;
  _Bool local_1;
  
  mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)(in_RDX + 0x2058);
  iVar1 = av1_ref_frame_type((MV_REFERENCE_FRAME *)
                             CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  this_mode = (PREDICTION_MODE)((uint)in_stack_ffffffffffffff8c >> 0x18);
  uVar5 = CONCAT13(iVar1,(int3)in_stack_ffffffffffffffac);
  iVar2 = has_second_ref(mbmi_00);
  if ((*(int *)(in_RDI + 0x1c4) != 0) && (0 < in_R9D)) {
    if ((mbmi_00->ref_frame[0] == '\x02') ||
       (((mbmi_00->ref_frame[0] == '\x03' || (mbmi_00->ref_frame[1] == '\x02')) ||
        (mbmi_00->ref_frame[1] == '\x03')))) {
      iVar3 = have_nearmv_in_inter_mode(mbmi_00->mode);
      in_stack_ffffffffffffffa4 = (uint)(iVar3 != 0);
      if (*(ushort *)
           (in_RDX + 0x4010 + (long)(char)((uint)uVar5 >> 0x18) * 8 +
           (long)(int)(in_R9D + in_stack_ffffffffffffffa4) * 2) < 0x280) {
        return true;
      }
    }
    if (((1 < *(int *)(in_RDI + 0x1c4)) && (iVar2 == 0)) &&
       ((iVar3 = have_newmv_in_inter_mode(mbmi_00->mode), iVar3 != 0 &&
        ((mbmi_00->ref_frame[0] != *(char *)(in_RSI + 0x1c) &&
         (mbmi_00->ref_frame[0] != *(char *)(in_RSI + 0x1d))))))) {
      iVar3 = have_nearmv_in_inter_mode(mbmi_00->mode);
      in_stack_ffffffffffffffa0 = (uint)(iVar3 != 0);
      in_stack_ffffffffffffff9c =
           prune_ref_mv_idx_using_qindex(*(int *)(in_RDI + 0x1c4),*(int *)(in_RDX + 0x4208),in_R9D);
      if ((in_stack_ffffffffffffff9c != 0) &&
         (*(ushort *)
           (in_RDX + 0x4010 + (long)(char)((uint)uVar5 >> 0x18) * 8 +
           (long)(int)(in_R9D + in_stack_ffffffffffffffa0) * 2) < 0x280)) {
        return true;
      }
    }
  }
  *(ushort *)&mbmi_00->field_0xa7 =
       *(ushort *)&mbmi_00->field_0xa7 & 0xffcf | ((byte)in_R9D & 3) << 4;
  if ((iVar2 == 0) ||
     (iVar3 = is_single_newmv_valid
                        ((HandleInterModeArgs *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff90,this_mode), iVar3 != 0)) {
    iVar3 = *(int *)(in_RCX + 0x70) + *(int *)(in_RCX + 0x74);
    lVar4 = (long)iVar3;
    iVar2 = get_drl_cost((MB_MODE_INFO *)CONCAT44(uVar5,iVar2),
                         (MB_MODE_INFO_EXT *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (int (*) [2])CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         (int8_t)(iVar3 >> 0x1f));
    if ((in_R8 < (iVar2 + lVar4) * (long)*(int *)(in_RDX + 0x4218) + 0x100 >> 9) &&
       ((mbmi_00->mode != '\r' && (mbmi_00->mode != '\x11')))) {
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static bool ref_mv_idx_early_breakout(
    const SPEED_FEATURES *const sf,
    const RefFrameDistanceInfo *const ref_frame_dist_info, MACROBLOCK *x,
    const HandleInterModeArgs *const args, int64_t ref_best_rd,
    int ref_mv_idx) {
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  const MB_MODE_INFO_EXT *const mbmi_ext = &x->mbmi_ext;
  const int8_t ref_frame_type = av1_ref_frame_type(mbmi->ref_frame);
  const int is_comp_pred = has_second_ref(mbmi);
  if (sf->inter_sf.reduce_inter_modes && ref_mv_idx > 0) {
    if (mbmi->ref_frame[0] == LAST2_FRAME ||
        mbmi->ref_frame[0] == LAST3_FRAME ||
        mbmi->ref_frame[1] == LAST2_FRAME ||
        mbmi->ref_frame[1] == LAST3_FRAME) {
      const int has_nearmv = have_nearmv_in_inter_mode(mbmi->mode) ? 1 : 0;
      if (mbmi_ext->weight[ref_frame_type][ref_mv_idx + has_nearmv] <
          REF_CAT_LEVEL) {
        return true;
      }
    }
    // TODO(any): Experiment with reduce_inter_modes for compound prediction
    if (sf->inter_sf.reduce_inter_modes >= 2 && !is_comp_pred &&
        have_newmv_in_inter_mode(mbmi->mode)) {
      if (mbmi->ref_frame[0] != ref_frame_dist_info->nearest_past_ref &&
          mbmi->ref_frame[0] != ref_frame_dist_info->nearest_future_ref) {
        const int has_nearmv = have_nearmv_in_inter_mode(mbmi->mode) ? 1 : 0;
        const int do_prune = prune_ref_mv_idx_using_qindex(
            sf->inter_sf.reduce_inter_modes, x->qindex, ref_mv_idx);
        if (do_prune &&
            (mbmi_ext->weight[ref_frame_type][ref_mv_idx + has_nearmv] <
             REF_CAT_LEVEL)) {
          return true;
        }
      }
    }
  }

  mbmi->ref_mv_idx = ref_mv_idx;
  if (is_comp_pred && (!is_single_newmv_valid(args, mbmi, mbmi->mode))) {
    return true;
  }
  size_t est_rd_rate = args->ref_frame_cost + args->single_comp_cost;
  const int drl_cost = get_drl_cost(
      mbmi, mbmi_ext, x->mode_costs.drl_mode_cost0, ref_frame_type);
  est_rd_rate += drl_cost;
  if (RDCOST(x->rdmult, est_rd_rate, 0) > ref_best_rd &&
      mbmi->mode != NEARESTMV && mbmi->mode != NEAREST_NEARESTMV) {
    return true;
  }
  return false;
}